

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void __thiscall tcmalloc::SizeMap::Init(SizeMap *this)

{
  byte bVar1;
  int iVar2;
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem b_02;
  LogItem b_03;
  LogItem b_04;
  LogItem b_05;
  LogItem b_06;
  LogItem b_07;
  LogItem c_00;
  LogItem c_01;
  LogItem c_02;
  LogItem c_03;
  LogItem c_04;
  LogItem c_05;
  LogItem c_06;
  LogItem c_07;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  LogItem d_02;
  LogItem d_03;
  LogItem d_04;
  LogItem d_05;
  LogItem d_06;
  LogItem d_07;
  undefined1 auVar3 [16];
  int c;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  anon_union_8_4_e5b1a622_for_u_ aVar8;
  int s;
  uint uVar9;
  int i;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int log;
  int iVar14;
  anon_union_8_4_e5b1a622_for_u_ aVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined4 uStack_1bc;
  anon_union_8_4_e5b1a622_for_u_ aStack_1b8;
  undefined4 uStack_1ac;
  anon_union_8_4_e5b1a622_for_u_ aStack_1a8;
  undefined4 uStack_19c;
  anon_union_8_4_e5b1a622_for_u_ aStack_198;
  undefined4 uStack_18c;
  anon_union_8_4_e5b1a622_for_u_ aStack_188;
  undefined4 uStack_17c;
  anon_union_8_4_e5b1a622_for_u_ aStack_178;
  undefined4 uStack_16c;
  anon_union_8_4_e5b1a622_for_u_ aStack_168;
  undefined4 uStack_15c;
  anon_union_8_4_e5b1a622_for_u_ aStack_158;
  undefined4 uStack_14c;
  anon_union_8_4_e5b1a622_for_u_ aStack_148;
  undefined4 uStack_13c;
  anon_union_8_4_e5b1a622_for_u_ aStack_138;
  undefined4 uStack_12c;
  undefined4 uStack_11c;
  undefined4 uStack_10c;
  undefined4 uStack_fc;
  undefined4 uStack_ec;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  undefined4 uStack_bc;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  undefined4 uStack_8c;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  anon_union_8_4_e5b1a622_for_u_ aStack_68;
  undefined4 uStack_5c;
  anon_union_8_4_e5b1a622_for_u_ aStack_58;
  undefined4 uStack_4c;
  anon_union_8_4_e5b1a622_for_u_ aStack_48;
  
  if (FLAGS_tcmalloc_transfer_num_objects == 0) {
    pcVar6 = TCMallocGetenvSafe("TCMALLOC_TRANSFER_NUM_OBJ");
    if (pcVar6 == (char *)0x0) {
      FLAGS_tcmalloc_transfer_num_objects = 0x20;
    }
    else {
      lVar7 = strtol(pcVar6,(char **)0x0,10);
      FLAGS_tcmalloc_transfer_num_objects = (int)lVar7;
    }
  }
  pcVar6 = TCMallocGetenvSafe("TCMALLOC_OVERRIDE_PAGESIZE");
  iVar4 = getpagesize();
  aVar8.snum = commandlineflags::StringToLongLong(pcVar6,(long)iVar4);
  aVar15.snum = 0x2000;
  if ((char *)0x2000 < aVar8.str) {
    aVar15.snum = aVar8.snum;
  }
  if ((aVar15.unum & 0x1fff) != 0 && (char *)0x2000 < aVar8.str) {
    d._4_4_ = uStack_10c;
    d.tag_ = 2;
    b._4_4_ = uStack_12c;
    b.tag_ = 2;
    b.u_.str = aVar8.str;
    auVar3._4_8_ = ", malloc: ";
    auVar3._0_4_ = uStack_11c;
    auVar3._12_4_ = 0;
    d.u_.snum = 0x2000;
    Log(kLog,"/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
        ,0x95,(LogItem)(ZEXT816(0x132c29) << 0x40),b,(LogItem)(auVar3 << 0x20),d);
    aVar15.snum = 0x2000;
  }
  this->min_span_size_in_pages_ = aVar15.unum >> 0xd;
  iVar4 = FLAGS_tcmalloc_transfer_num_objects;
  uVar11 = 8;
  uVar17 = 1;
  while( true ) {
    aVar8 = (anon_union_8_4_e5b1a622_for_u_)(long)(int)uVar17;
    if (0x40000 < uVar11) {
      this->num_size_classes = (size_t)aVar8;
      if (0x80 < uVar17) {
        d_00._4_4_ = uStack_18c;
        d_00.tag_ = 4;
        c_00._4_4_ = uStack_ec;
        c_00.tag_ = 2;
        b_00._4_4_ = uStack_fc;
        b_00.tag_ = 1;
        b_00.u_.snum = (int64_t)aVar8.str;
        c_00.u_.snum = 0x80;
        d_00.u_.str = aStack_188.str;
        Log(kCrash,
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
            0xd3,(LogItem)(ZEXT816(0x132d01) << 0x40),b_00,c_00,d_00);
      }
      uVar17 = 0;
      for (uVar11 = 1; uVar11 < this->num_size_classes; uVar11 = uVar11 + 1) {
        iVar4 = this->class_to_size_[uVar11];
        for (; (int)uVar17 <= iVar4; uVar17 = uVar17 + 8) {
          if (uVar17 < 0x401) {
            uVar12 = (long)(int)uVar17 + 7U >> 3;
          }
          else {
            uVar12 = (ulong)(uVar17 + 0x3c7f >> 7);
          }
          this->class_array_[uVar12] = (uchar)uVar11;
        }
        uVar17 = iVar4 + 8;
      }
      aVar15.str = (char *)0x0;
      while (iVar4 = FLAGS_tcmalloc_transfer_num_objects, aVar15.str < (char *)0x40001) {
        if ((ulong)aVar15 < (char *)0x401) {
          uVar11 = aVar15.unum >> 3;
        }
        else {
          uVar11 = aVar15.snum + 0x3c7fU >> 7;
        }
        bVar1 = this->class_array_[uVar11];
        uVar11 = (ulong)bVar1;
        if ((uVar11 == 0) || (this->num_size_classes <= uVar11)) {
          d_01._4_4_ = uStack_17c;
          d_01.tag_ = 4;
          c_01._4_4_ = uStack_cc;
          c_01.tag_ = 2;
          b_01._4_4_ = uStack_dc;
          b_01.tag_ = 1;
          b_01.u_.unum._0_1_ = bVar1;
          b_01.u_.snum._1_7_ = 0;
          c_01.u_.str = aVar15.str;
          d_01.u_.str = aStack_178.str;
          Log(kCrash,
              "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
              ,0xe5,(LogItem)(ZEXT816(0x132d28) << 0x40),b_01,c_01,d_01);
        }
        if ((1 < bVar1) && (aVar15.str <= (char *)(long)this->class_to_size_[bVar1 - 1])) {
          d_02._4_4_ = uStack_16c;
          d_02.tag_ = 4;
          c_02._4_4_ = uStack_ac;
          c_02.tag_ = 2;
          b_02._4_4_ = uStack_bc;
          b_02.tag_ = 1;
          b_02.u_.unum._0_1_ = bVar1;
          b_02.u_.snum._1_7_ = 0;
          c_02.u_.str = aVar15.str;
          d_02.u_.str = aStack_168.str;
          Log(kCrash,
              "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
              ,0xe9,(LogItem)(ZEXT816(0x132d45) << 0x40),b_02,c_02,d_02);
        }
        aVar8 = (anon_union_8_4_e5b1a622_for_u_)(long)this->class_to_size_[uVar11];
        if (aVar8.str == (char *)0x0 || aVar8.str < aVar15.str) {
          d_03._4_4_ = uStack_7c;
          d_03.tag_ = 2;
          c_03._4_4_ = uStack_8c;
          c_03.tag_ = 2;
          b_03._4_4_ = uStack_9c;
          b_03.tag_ = 1;
          b_03.u_.unum._0_1_ = bVar1;
          b_03.u_.snum._1_7_ = 0;
          c_03.u_.str = aVar8.str;
          d_03.u_.str = aVar15.str;
          Log(kCrash,
              "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
              ,0xee,(LogItem)(ZEXT816(0x132d78) << 0x40),b_03,c_03,d_03);
        }
        aVar8.str = (char *)(aVar15.snum + 8);
        bVar18 = aVar15.str < (char *)0x401;
        aVar15.str = (char *)(aVar15.snum + 0x80);
        if (bVar18) {
          aVar15.str = aVar8.str;
        }
      }
      uVar11 = 0x10;
      do {
        if (0x2000 < uVar11) {
          uVar11 = this->num_size_classes;
          for (lVar7 = 0x220; lVar7 - 0x21fU < uVar11; lVar7 = lVar7 + 1) {
            iVar10 = this->class_to_size_[lVar7 - 0x21fU & 0xffffffff];
            if ((long)iVar10 == 0) {
              iVar10 = 0;
            }
            else {
              auVar19._8_4_ = iVar10 >> 0x1f;
              auVar19._0_8_ = (long)iVar10;
              auVar19._12_4_ = 0x45300000;
              iVar10 = (int)(65536.0 /
                            ((auVar19._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar10) - 4503599627370496.0)));
              if (iVar10 < 3) {
                iVar10 = 2;
              }
              if (iVar4 <= iVar10) {
                iVar10 = iVar4;
              }
            }
            *(int *)(this->class_array_ + lVar7 * 4) = iVar10;
          }
          return;
        }
        uVar12 = uVar11;
        while (uVar12 < 0x2000) {
          if (uVar12 < 0x401) {
            uVar16 = uVar12 >> 3;
          }
          else {
            uVar16 = uVar12 + 0x3c7f >> 7;
          }
          uVar12 = uVar12 + uVar11;
          if ((uVar11 - 1 & (long)this->class_to_size_[this->class_array_[uVar16]]) != 0) {
            d_06._4_4_ = uStack_13c;
            d_06.tag_ = 4;
            c_06._4_4_ = uStack_14c;
            c_06.tag_ = 4;
            b_06._4_4_ = uStack_15c;
            b_06.tag_ = 4;
            b_06.u_.str = aStack_158.str;
            c_06.u_.str = aStack_148.str;
            d_06.u_.str = aStack_138.str;
            Log(kCrash,
                "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
                ,0x103,(LogItem)(ZEXT816(0x132d95) << 0x40),b_06,c_06,d_06);
            do {
            } while( true );
          }
        }
        uVar11 = uVar11 * 2;
      } while( true );
    }
    if (uVar11 < 0x80) {
      uVar5 = (uint)(0xf < uVar11) * 8 + 8;
    }
    else {
      iVar14 = 0;
      uVar12 = uVar11;
      for (iVar10 = 4; -1 < iVar10; iVar10 = iVar10 + -1) {
        iVar13 = 1 << ((byte)iVar10 & 0x1f);
        uVar16 = uVar12 >> ((byte)iVar13 & 0x3f);
        iVar2 = 0;
        if (uVar16 != 0) {
          uVar12 = uVar16;
          iVar2 = iVar13;
        }
        iVar14 = iVar14 + iVar2;
      }
      uVar5 = (1 << ((byte)iVar14 & 0x1f)) / 8;
    }
    uVar9 = 0x2000;
    if (uVar5 < 0x2000) {
      uVar9 = uVar5;
    }
    if (uVar5 < 0x10 && 0xf < uVar11) break;
    if ((uVar9 & uVar9 - 1) != 0) {
      d_05._4_4_ = uStack_4c;
      d_05.tag_ = 4;
      c_05._4_4_ = uStack_5c;
      c_05.tag_ = 4;
      b_05._4_4_ = uStack_6c;
      b_05.tag_ = 4;
      b_05.u_.str = aStack_68.str;
      c_05.u_.str = aStack_58.str;
      d_05.u_.str = aStack_48.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
          0x67,(LogItem)(ZEXT816(0x132e07) << 0x40),b_05,c_05,d_05);
      do {
      } while( true );
    }
    if (uVar11 % (ulong)uVar9 != 0) {
      d_07._4_4_ = uStack_19c;
      d_07.tag_ = 4;
      c_07._4_4_ = uStack_1ac;
      c_07.tag_ = 4;
      b_07._4_4_ = uStack_1bc;
      b_07.tag_ = 4;
      b_07.u_.str = aStack_1b8.str;
      c_07.u_.str = aStack_1a8.str;
      d_07.u_.str = aStack_198.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
          0xae,(LogItem)(ZEXT816(0x132ce9) << 0x40),b_07,c_07,d_07);
      do {
      } while( true );
    }
    iVar10 = (int)(65536.0 / (double)(long)uVar11);
    if (iVar10 < 3) {
      iVar10 = 2;
    }
    if (iVar4 <= iVar10) {
      iVar10 = iVar4;
    }
    pcVar6 = (char *)0x0;
    do {
      do {
        pcVar6 = pcVar6 + aVar15.str;
      } while ((ulong)pcVar6 >> 3 < (ulong)pcVar6 % uVar11);
    } while ((ulong)pcVar6 / uVar11 < (ulong)(long)(iVar10 / 4));
    if ((((int)uVar17 < 2) ||
        (uVar5 = uVar17 - 1, (ulong)pcVar6 >> 0xd != this->class_to_pages_[uVar5])) ||
       (((ulong)pcVar6 & 0xffffffffffffe000) / uVar11 !=
        ((ulong)pcVar6 & 0xffffffffffffe000) / (ulong)(long)this->class_to_size_[uVar5])) {
      this->class_to_pages_[aVar8.snum] = (ulong)pcVar6 >> 0xd;
      this->class_to_size_[aVar8.snum] = (int32_t)uVar11;
      uVar17 = uVar17 + 1;
    }
    else {
      this->class_to_size_[uVar5] = (int32_t)uVar11;
    }
    uVar11 = uVar11 + uVar9;
  }
  d_04._4_4_ = uStack_4c;
  d_04.tag_ = 4;
  c_04._4_4_ = uStack_5c;
  c_04.tag_ = 4;
  b_04._4_4_ = uStack_6c;
  b_04.tag_ = 4;
  b_04.u_.str = aStack_68.str;
  c_04.u_.str = aStack_58.str;
  d_04.u_.str = aStack_48.str;
  Log(kCrash,"/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
      ,0x66,(LogItem)(ZEXT816(0x132ddc) << 0x40),b_04,c_04,d_04);
  do {
  } while( true );
}

Assistant:

void SizeMap::Init() {
  InitTCMallocTransferNumObjects();

#if (!defined(_WIN32) || defined(TCMALLOC_BRAVE_EFFECTIVE_PAGE_SIZE)) && !defined(TCMALLOC_COWARD_EFFECTIVE_PAGE_SIZE)
  size_t native_page_size = tcmalloc::commandlineflags::StringToLongLong(
    TCMallocGetenvSafe("TCMALLOC_OVERRIDE_PAGESIZE"), getpagesize());
#else
  // So windows getpagesize() returns 64k. Because that is
  // "granularity size" w.r.t. their virtual memory facility. So kinda
  // maybe not a bad idea to also have effective logical pages at 64k
  // too. But it breaks frag_unittest (for mostly harmless
  // reason). And I am not brave enough to have our behavior change so
  // much on windows (which isn't that much; people routinely run 256k
  // logical pages anyways).
  constexpr size_t native_page_size = kPageSize;
#endif

  size_t min_span_size = std::max<size_t>(native_page_size, kPageSize);
  if (min_span_size > kPageSize && (min_span_size % kPageSize) != 0) {
    Log(kLog, __FILE__, __LINE__, "This should never happen, but somehow "
        "we got systems page size not power of 2 and not multiple of "
        "malloc's logical page size. Releasing memory back will mostly not happen. "
        "system: ", native_page_size, ", malloc: ", kPageSize);
    min_span_size = kPageSize;
  }

  min_span_size_in_pages_ = min_span_size / kPageSize;

  // Do some sanity checking on add_amount[]/shift_amount[]/class_array[]
  if (ClassIndex(0) != 0) {
    Log(kCrash, __FILE__, __LINE__,
        "Invalid class index for size 0", ClassIndex(0));
  }
  if (ClassIndex(kMaxSize) >= sizeof(class_array_)) {
    Log(kCrash, __FILE__, __LINE__,
        "Invalid class index for kMaxSize", ClassIndex(kMaxSize));
  }

  // Compute the size classes we want to use
  int sc = 1;   // Next size class to assign
  int alignment = kAlignment;
  CHECK_CONDITION(kAlignment <= kMinAlign);
  for (size_t size = kAlignment; size <= kMaxSize; size += alignment) {
    alignment = AlignmentForSize(size);
    CHECK_CONDITION((size % alignment) == 0);

    int blocks_to_move = NumMoveSize(size) / 4;
    size_t psize = 0;
    do {
      psize += min_span_size;
      // Allocate enough pages so leftover is less than 1/8 of total.
      // This bounds wasted space to at most 12.5%.
      while ((psize % size) > (psize >> 3)) {
        psize += min_span_size;
      }
      // Continue to add pages until there are at least as many objects in
      // the span as are needed when moving objects from the central
      // freelists and spans to the thread caches.
    } while ((psize / size) < (blocks_to_move));
    const size_t my_pages = psize >> kPageShift;

    if (sc > 1 && my_pages == class_to_pages_[sc-1]) {
      // See if we can merge this into the previous class without
      // increasing the fragmentation of the previous class.
      const size_t my_objects = (my_pages << kPageShift) / size;
      const size_t prev_objects = (class_to_pages_[sc-1] << kPageShift)
                                  / class_to_size_[sc-1];
      if (my_objects == prev_objects) {
        // Adjust last class to include this size
        class_to_size_[sc-1] = size;
        continue;
      }
    }

    // Add new class
    class_to_pages_[sc] = my_pages;
    class_to_size_[sc] = size;
    sc++;
  }
  num_size_classes = sc;
  if (sc > kClassSizesMax) {
    Log(kCrash, __FILE__, __LINE__,
        "too many size classes: (found vs. max)", sc, kClassSizesMax);
  }

  // Initialize the mapping arrays
  int next_size = 0;
  for (int c = 1; c < num_size_classes; c++) {
    const int max_size_in_class = class_to_size_[c];
    for (int s = next_size; s <= max_size_in_class; s += kAlignment) {
      class_array_[ClassIndex(s)] = c;
    }
    next_size = max_size_in_class + kAlignment;
  }

  // Double-check sizes just to be safe
  for (size_t size = 0; size <= kMaxSize;) {
    const int sc = SizeClass(size);
    if (sc <= 0 || sc >= num_size_classes) {
      Log(kCrash, __FILE__, __LINE__,
          "Bad size class (class, size)", sc, size);
    }
    if (sc > 1 && size <= class_to_size_[sc-1]) {
      Log(kCrash, __FILE__, __LINE__,
          "Allocating unnecessarily large class (class, size)", sc, size);
    }
    const size_t s = class_to_size_[sc];
    if (size > s || s == 0) {
      Log(kCrash, __FILE__, __LINE__,
          "Bad (class, size, requested)", sc, s, size);
    }
    if (size <= kMaxSmallSize) {
      size += 8;
    } else {
      size += 128;
    }
  }

  // Our fast-path aligned allocation functions rely on 'naturally
  // aligned' sizes to produce aligned addresses. Lets check if that
  // holds for size classes that we produced.
  //
  // I.e. we're checking that
  //
  // align = (1 << shift), malloc(i * align) % align == 0,
  //
  // for all align values up to kPageSize.
  for (size_t align = kMinAlign; align <= kPageSize; align <<= 1) {
    for (size_t size = align; size < kPageSize; size += align) {
      CHECK_CONDITION(class_to_size_[SizeClass(size)] % align == 0);
    }
  }

  // Initialize the num_objects_to_move array.
  for (size_t cl = 1; cl  < num_size_classes; ++cl) {
    num_objects_to_move_[cl] = NumMoveSize(ByteSizeForClass(cl));
  }
}